

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O3

bool __thiscall ritobin::io::impl_text_read::TextReader::read_name(TextReader *this,string *value)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  byte *pbVar4;
  size_t sVar5;
  string_view sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  sVar6 = read_word(this);
  pbVar4 = (byte *)sVar6._M_str;
  sVar3 = sVar6._M_len;
  if ((sVar3 == 0) || (0x19 < (byte)((*pbVar4 & 0xdf) + 0xbf))) {
LAB_001308a1:
    bVar2 = false;
  }
  else {
    sVar5 = 0;
    do {
      bVar1 = pbVar4[sVar5];
      if (((9 < (byte)(bVar1 - 0x30)) && (bVar1 != 0x5f)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)))
      goto LAB_001308a1;
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pbVar4,pbVar4 + sVar3);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (value,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool read_name(std::string& value) noexcept {
            auto const word = read_word();
            if (word.empty()) {
                return false;
            }
            if (!in_range<'a', 'z'>(word[0]) && !in_range<'A', 'Z'>(word[0])) {
                return false;
            }
            for (auto const& c : word) {
                if (c != '_'
                    && !in_range<'a', 'z'>(c)
                    && !in_range<'A', 'Z'>(c)
                    && !in_range<'0', '9'>(c)) {
                    return false;
                }
            }
            value = { std::string(word) };
            return true;
        }